

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O1

bool duckdb::ExtractAll(StringPiece *input,RE2 *pattern,idx_t *startpos,StringPiece *groups,
                       int ngroups)

{
  idx_t iVar1;
  bool bVar2;
  const_pointer pcVar3;
  
  bVar2 = duckdb_re2::RE2::Match(pattern,input,*startpos,input->size_,UNANCHORED,groups,ngroups + 1)
  ;
  if (bVar2) {
    iVar1 = *startpos;
    pcVar3 = groups->data_ + (groups->size_ - (long)(input->data_ + iVar1));
    if ((pcVar3 == (const_pointer)0x0) && (pcVar3 = (const_pointer)0x1, iVar1 + 1 < input->size_)) {
      pcVar3 = (const_pointer)0x1;
    }
    *startpos = (idx_t)(pcVar3 + iVar1);
  }
  return bVar2;
}

Assistant:

bool ExtractAll(duckdb_re2::StringPiece &input, duckdb_re2::RE2 &pattern, idx_t *startpos,
                duckdb_re2::StringPiece *groups, int ngroups) {

	D_ASSERT(pattern.ok());
	D_ASSERT(pattern.NumberOfCapturingGroups() == ngroups);

	if (!pattern.Match(input, *startpos, input.size(), pattern.UNANCHORED, groups, ngroups + 1)) {
		return false;
	}
	idx_t consumed = static_cast<size_t>(groups[0].end() - (input.begin() + *startpos));
	if (!consumed) {
		// Empty match found, have to manually forward the input
		// to avoid an infinite loop
		// FIXME: support unicode characters
		consumed++;
		while (*startpos + consumed < input.length() && !IsCharacter(input[*startpos + consumed])) {
			consumed++;
		}
	}
	*startpos += consumed;
	return true;
}